

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O2

void __thiscall tcu::x11::XlibWindow::setDimensions(XlibWindow *this,int width,int height)

{
  Display *pDVar1;
  XWindowChanges changes;
  XEvent myevent;
  
  pDVar1 = this->m_display->m_display;
  XConfigureWindow(pDVar1,this->m_window,0xc);
  XFlush(pDVar1);
  do {
    while( true ) {
      XNextEvent(pDVar1,&myevent);
      if (myevent.type == 0x16) break;
      XlibDisplay::processEvent(this->m_display,&myevent);
    }
  } while ((myevent.xexpose.count != width) || (myevent.xgraphicsexpose.major_code != height));
  return;
}

Assistant:

void XlibWindow::setDimensions (int width, int height)
{
	const unsigned int	mask		= CWWidth | CWHeight;
	XWindowChanges		changes;
	::Display*			dpy			= m_display.getXDisplay();
	XEvent				myevent;
	changes.width	= width;
	changes.height	= height;
	XConfigureWindow(dpy, m_window, mask, &changes);
	XFlush(dpy);

	for(;;)
	{
		XNextEvent(dpy, &myevent);
		if (myevent.type == ConfigureNotify) {
			XConfigureEvent e = myevent.xconfigure;
			if (e.width == width && e.height == height)
				break;
		}
		else
			m_display.processEvent(myevent);
	}
}